

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inputs.cpp
# Opt level: O1

double helics::doubleExtractAndConvert
                 (data_view *dv,shared_ptr<units::precise_unit> *inputUnits,
                 shared_ptr<units::precise_unit> *outputUnits)

{
  element_type *this;
  precise_unit *start;
  precise_unit *result;
  double val;
  double local_20;
  
  detail::convertFromBinary((byte *)(dv->dblock)._M_str,&local_20);
  this = (inputUnits->super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if ((this != (element_type *)0x0) &&
     (start = (outputUnits->super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr, start != (precise_unit *)0x0)) {
    local_20 = ::units::convert<units::precise_unit,units::precise_unit>
                         ((units *)this,local_20,start,result);
  }
  return local_20;
}

Assistant:

double doubleExtractAndConvert(const data_view& dv,
                               const std::shared_ptr<units::precise_unit>& inputUnits,
                               const std::shared_ptr<units::precise_unit>& outputUnits)
{
    auto V = ValueConverter<double>::interpret(dv);
    if ((inputUnits) && (outputUnits)) {
        V = units::convert(V, *inputUnits, *outputUnits);
    }
    return V;
}